

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

int align_buffer_end(flatcc_builder_t *B,uint16_t *align,uint16_t block_align,int is_nested)

{
  flatbuffers_uoffset_t fVar1;
  flatcc_builder_ref_t fVar2;
  undefined1 local_b8 [8];
  flatcc_iov_state_t iov;
  size_t end_pad;
  int is_nested_local;
  uint16_t block_align_local;
  uint16_t *align_local;
  flatcc_builder_t *B_local;
  
  if (block_align == 0) {
    if (B->block_align == 0) {
      block_align = 1;
    }
    else {
      block_align = B->block_align;
    }
  }
  get_min_align(align,4);
  get_min_align(align,block_align);
  if (is_nested == 0) {
    fVar1 = back_pad(B,*align);
    iov.iov[7].iov_len = (size_t)fVar1;
    if ((void *)iov.iov[7].iov_len != (void *)0x0) {
      local_b8 = (undefined1  [8])0x0;
      if ((void *)iov.iov[7].iov_len != (void *)0x0) {
        iov._8_8_ = flatcc_builder_padding_base;
        local_b8 = (undefined1  [8])iov.iov[7].iov_len;
        iov.iov[0].iov_base = (void *)iov.iov[7].iov_len;
      }
      iov.len._1_3_ = 0;
      iov.len._0_1_ = (void *)iov.iov[7].iov_len != (void *)0x0;
      fVar2 = emit_back(B,(flatcc_iov_state_t *)local_b8);
      if (fVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                      ,0x2cd,"int align_buffer_end(flatcc_builder_t *, uint16_t *, uint16_t, int)");
      }
    }
  }
  return 0;
}

Assistant:

static int align_buffer_end(flatcc_builder_t *B, uint16_t *align, uint16_t block_align, int is_nested)
{
    size_t end_pad;
    iov_state_t iov;

    block_align = block_align ? block_align : B->block_align ? B->block_align : 1;
    get_min_align(align, field_size);
    get_min_align(align, block_align);
    /* Pad end of buffer to multiple. */
    if (!is_nested) {
        end_pad = back_pad(B, *align);
        if (end_pad) {
            init_iov();
            push_iov(_pad, end_pad);
            if (0 == emit_back(B, &iov)) {
                check(0, "emitter rejected buffer content");
                return -1;
            }
        }
    }
    return 0;
}